

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O3

void pmaxud_(PDISASM pMyDisasm)

{
  undefined8 uVar1;
  
  if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
    if ((pMyDisasm->Reserved_).VEX.pp == '\x01') {
      uVar1 = 0x717578616d7076;
      if ((pMyDisasm->Reserved_).EVEX.W == '\0') {
        uVar1 = 0x647578616d7076;
      }
      *(undefined8 *)(pMyDisasm->Instruction).Mnemonic = uVar1;
      (pMyDisasm->Reserved_).EVEX.tupletype = '\x01';
LAB_0012f04d:
      ArgsVEX(pMyDisasm);
      return;
    }
  }
  else if ((pMyDisasm->Prefix).OperandSize == '\x01') {
    (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
    (pMyDisasm->Prefix).OperandSize = '\b';
    if ((pMyDisasm->Reserved_).VEX.state != '\x01') {
      (pMyDisasm->Instruction).Category = 0x80000;
      (pMyDisasm->Reserved_).MemDecoration = 0x6d;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"pmaxud",7);
      (pMyDisasm->Reserved_).Register_ = 4;
      decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
      decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
      (pMyDisasm->Reserved_).EIP_ =
           (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
      (pMyDisasm->Operand1).AccessMode = 3;
      return;
    }
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vpmaxud",8);
    goto LAB_0012f04d;
  }
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
  (pMyDisasm->Operand1).AccessMode = 0;
  (pMyDisasm->Operand2).AccessMode = 0;
  (pMyDisasm->Operand3).AccessMode = 0;
  (pMyDisasm->Operand4).AccessMode = 0;
  (pMyDisasm->Operand5).AccessMode = 0;
  (pMyDisasm->Operand6).AccessMode = 0;
  (pMyDisasm->Operand7).AccessMode = 0;
  (pMyDisasm->Operand8).AccessMode = 0;
  (pMyDisasm->Operand9).AccessMode = 0;
  (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
  return;
}

Assistant:

void __bea_callspec__ pmaxud_(PDISASM pMyDisasm)
{
  if (GV.EVEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      if (GV.EVEX.W == 0) {
        #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpmaxud");
        #endif
      }
      else {
        #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpmaxuq");
        #endif
      }
      GV.EVEX.tupletype = FULL;
      ArgsVEX(pMyDisasm);
    }
    else {
      failDecode(pMyDisasm);
    }
  }

   /* ========== 0x66 */
  else if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
       GV.OperandSize = GV.OriginalOperandSize;
       pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
       if (GV.VEX.state == InUsePrefix) {
         #ifndef BEA_LIGHT_DISASSEMBLY
            (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpmaxud");
         #endif
         ArgsVEX(pMyDisasm);
       } else {
         pMyDisasm->Instruction.Category = SSE41_INSTRUCTION;
         GV.MemDecoration = Arg2_m128_xmm;
         #ifndef BEA_LIGHT_DISASSEMBLY
            (void) strcpy (pMyDisasm->Instruction.Mnemonic, "pmaxud");
         #endif
         GV.Register_ = SSE_REG;
         GxEx(pMyDisasm);
         pMyDisasm->Operand1.AccessMode = READ + WRITE;

       }
   }
   else {
       failDecode(pMyDisasm);
   }
}